

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_2x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar9 = 0;
  memset(data,0,0x100);
  do {
    bVar3 = *(byte *)(*(long *)((long)sample_data + lVar9) + (ulong)start_col);
    bVar4 = *(byte *)(*(long *)((long)sample_data + lVar9) + 1 + (ulong)start_col);
    data[lVar9] = ((uint)bVar4 + (uint)bVar3) * 8 + -0x800;
    data[lVar9 + 1] = ((uint)bVar3 - (uint)bVar4) * 8;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x20);
  bVar5 = true;
  do {
    bVar6 = bVar5;
    iVar1 = data[0x18] + *data;
    iVar2 = data[0x10] + data[8];
    lVar9 = (long)(*data - data[0x18]);
    lVar7 = (long)(data[8] - data[0x10]);
    *data = iVar2 + iVar1;
    data[0x10] = iVar1 - iVar2;
    lVar8 = (lVar7 + lVar9) * 0x1151;
    data[8] = (int)(lVar9 * 0x187e + lVar8 + 0x1000U >> 0xd);
    data[0x18] = (int)(lVar8 + lVar7 * 0x1fffffffc4df + 0x1000U >> 0xd);
    data = data + 1;
    bVar5 = false;
  } while (bVar6);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_2x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* We must also scale the output by (8/2)*(8/4) = 2**3, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp0 + tmp1 - 2 * CENTERJSAMPLE) << 3);

    /* Odd part */

    dataptr[1] = (DCTELEM) ((tmp0 - tmp1) << 3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * 4-point FDCT kernel,
   * cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT].
   */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) (tmp0 + tmp1);
    dataptr[DCTSIZE*2] = (DCTELEM) (tmp0 - tmp1);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}